

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptSamplerType(HlslGrammar *this,TType *type)

{
  TSampler TVar1;
  EHlslTokenClass EVar2;
  uint uVar3;
  TType local_b8;
  
  EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  uVar3 = EVar2 - EHTokSampler;
  if (uVar3 < 7) {
    TVar1 = *(TSampler *)(&DAT_00852f24 + (ulong)uVar3 * 4);
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    local_b8._vptr_TType = (_func_int **)&PTR__TType_00af5e70;
    local_b8._8_4_ = 0x10e;
    local_b8.arraySizes = (TArraySizes *)0x0;
    local_b8.field_13.structure = (TTypeList *)0x0;
    local_b8.fieldName = (TString *)0x0;
    local_b8.typeName = (TString *)0x0;
    local_b8.typeParameters = (TTypeParameters *)0x0;
    local_b8.spirvType = (TSpirvType *)0x0;
    local_b8.qualifier.semanticName = (char *)0x0;
    local_b8.qualifier._16_1_ = 0;
    local_b8.qualifier.layoutOffset = -1;
    local_b8.qualifier.layoutAlign = -1;
    local_b8.qualifier.layoutPushConstant = false;
    local_b8.qualifier.layoutBufferReference = false;
    local_b8.qualifier.layoutPassthrough = false;
    local_b8.qualifier.layoutViewportRelative = false;
    local_b8.qualifier.layoutSecondaryViewportRelativeOffset = -0x800;
    local_b8.qualifier.layoutBindlessSampler = false;
    local_b8.qualifier.layoutBindlessImage = false;
    local_b8.qualifier.layoutShaderRecord = false;
    local_b8.qualifier.layoutFullQuads = false;
    local_b8.qualifier.layoutQuadDeriv = false;
    local_b8.qualifier.layoutHitObjectShaderRecordNV = false;
    local_b8.qualifier._44_1_ = 0;
    local_b8.qualifier._28_8_ = 0xffffffff001fcfff;
    local_b8.qualifier._36_8_ = 0xffffffffffffffff;
    local_b8.qualifier.spirvStorageClass = -1;
    local_b8.qualifier.spirvDecorate = (TSpirvDecorate *)0x0;
    local_b8.qualifier._8_8_ = 5;
    local_b8.sampler = TVar1;
    TType::shallowCopy(type,&local_b8);
  }
  return uVar3 < 7;
}

Assistant:

bool HlslGrammar::acceptSamplerType(TType& type)
{
    // read sampler type
    const EHlslTokenClass samplerType = peek();

    // TODO: for DX9
    // TSamplerDim dim = EsdNone;

    bool isShadow = false;

    switch (samplerType) {
    case EHTokSampler:      break;
    case EHTokSampler1d:    /*dim = Esd1D*/; break;
    case EHTokSampler2d:    /*dim = Esd2D*/; break;
    case EHTokSampler3d:    /*dim = Esd3D*/; break;
    case EHTokSamplerCube:  /*dim = EsdCube*/; break;
    case EHTokSamplerState: break;
    case EHTokSamplerComparisonState: isShadow = true; break;
    default:
        return false;  // not a sampler declaration
    }

    advanceToken();  // consume the sampler type keyword

    TArraySizes* arraySizes = nullptr; // TODO: array

    TSampler sampler;
    sampler.setPureSampler(isShadow);

    type.shallowCopy(TType(sampler, EvqUniform, arraySizes));

    return true;
}